

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O0

void __thiscall
ExprVisitorTest_InvalidExpr_Test::ExprVisitorTest_InvalidExpr_Test
          (ExprVisitorTest_InvalidExpr_Test *this)

{
  undefined8 *in_RDI;
  ExprVisitorTest *in_stack_00000040;
  
  ExprVisitorTest::ExprVisitorTest(in_stack_00000040);
  *in_RDI = &PTR__ExprVisitorTest_InvalidExpr_Test_0029ee40;
  return;
}

Assistant:

TEST_F(ExprVisitorTest, InvalidExpr) {
  using ::testing::_;
  typedef AllocatorRef< ::testing::NiceMock<MockAllocator> > Allocator;
  ::testing::NiceMock<MockAllocator> alloc;
  char buffer[100];
  mp::BasicExprFactory<Allocator> f((Allocator(&alloc)));

  // Corrupt a numeric expression and check if visiting it results in
  // assertion failure.
  EXPECT_CALL(alloc, allocate(_)).WillOnce(::testing::Return(buffer));
  auto e1 = f.MakeNumericConstant(0);
  std::fill(buffer, buffer + sizeof(buffer), 0);
  EXPECT_ASSERT(visitor_.Visit(e1), "invalid expression");

  // Corrupt a logical expression and check if visiting it results in
  // assertion failure.
  EXPECT_CALL(alloc, allocate(_)).WillOnce(::testing::Return(buffer));
  auto e2 = f.MakeLogicalConstant(false);
  std::fill(buffer, buffer + sizeof(buffer), 0);
  EXPECT_ASSERT(visitor_.Visit(e2), "invalid expression");
}